

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmLinkImplementation * __thiscall
cmGeneratorTarget::GetLinkImplementation(cmGeneratorTarget *this,string *config)

{
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *this_00;
  mapped_type *impl;
  string CONFIG;
  string local_40;
  cmGeneratorTarget *local_20;
  
  if (this->Target->IsImportedTarget == false) {
    cmsys::SystemTools::UpperCase(&local_40,config);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap>_>_>
               ::operator[](&this->LinkImplMap,&local_40)->
               super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
    ;
    local_20 = this;
    impl = std::
           map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
           ::operator[](this_00,&local_20);
    if (impl->LibrariesDone == false) {
      impl->LibrariesDone = true;
      ComputeLinkImplementationLibraries(this,config,impl,this);
    }
    if (impl->LanguagesDone == false) {
      impl->LanguagesDone = true;
      ComputeLinkImplementationLanguages(this,config,impl);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    impl = (mapped_type *)0x0;
  }
  return &impl->super_cmLinkImplementation;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}